

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlEncodeEntities(void)

{
  int iVar1;
  int iVar2;
  int val;
  uchar *val_00;
  int *val_01;
  uchar *val_02;
  int *val_03;
  int local_5c;
  int n_quoteChar;
  int quoteChar;
  int n_inlen;
  int *inlen;
  int n_in;
  uchar *in;
  int n_outlen;
  int *outlen;
  int n_out;
  uchar *out;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (outlen._4_4_ = 0; (int)outlen._4_4_ < 1; outlen._4_4_ = outlen._4_4_ + 1) {
    for (in._4_4_ = 0; (int)in._4_4_ < 2; in._4_4_ = in._4_4_ + 1) {
      for (inlen._4_4_ = 0; (int)inlen._4_4_ < 1; inlen._4_4_ = inlen._4_4_ + 1) {
        for (n_quoteChar = 0; n_quoteChar < 2; n_quoteChar = n_quoteChar + 1) {
          for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
            iVar1 = xmlMemBlocks();
            val_00 = gen_unsigned_char_ptr(outlen._4_4_,0);
            val_01 = gen_int_ptr(in._4_4_,1);
            val_02 = gen_const_unsigned_char_ptr(inlen._4_4_,2);
            val_03 = gen_int_ptr(n_quoteChar,3);
            iVar2 = gen_int(local_5c,4);
            val = htmlEncodeEntities(val_00,val_01,val_02,val_03,iVar2);
            desret_int(val);
            call_tests = call_tests + 1;
            des_unsigned_char_ptr(outlen._4_4_,val_00,0);
            des_int_ptr(in._4_4_,val_01,1);
            des_const_unsigned_char_ptr(inlen._4_4_,val_02,2);
            des_int_ptr(n_quoteChar,val_03,3);
            des_int(local_5c,iVar2,4);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlEncodeEntities",(ulong)(uint)(iVar2 - iVar1));
              ret_val = ret_val + 1;
              printf(" %d",(ulong)outlen._4_4_);
              printf(" %d",(ulong)in._4_4_);
              printf(" %d",(ulong)inlen._4_4_);
              printf(" %d",(ulong)(uint)n_quoteChar);
              printf(" %d");
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_htmlEncodeEntities(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    int mem_base;
    int ret_val;
    unsigned char * out; /* a pointer to an array of bytes to store the result */
    int n_out;
    int * outlen; /* the length of @out */
    int n_outlen;
    unsigned char * in; /* a pointer to an array of UTF-8 chars */
    int n_in;
    int * inlen; /* the length of @in */
    int n_inlen;
    int quoteChar; /* the quote character to escape (' or ") or zero. */
    int n_quoteChar;

    for (n_out = 0;n_out < gen_nb_unsigned_char_ptr;n_out++) {
    for (n_outlen = 0;n_outlen < gen_nb_int_ptr;n_outlen++) {
    for (n_in = 0;n_in < gen_nb_const_unsigned_char_ptr;n_in++) {
    for (n_inlen = 0;n_inlen < gen_nb_int_ptr;n_inlen++) {
    for (n_quoteChar = 0;n_quoteChar < gen_nb_int;n_quoteChar++) {
        mem_base = xmlMemBlocks();
        out = gen_unsigned_char_ptr(n_out, 0);
        outlen = gen_int_ptr(n_outlen, 1);
        in = gen_const_unsigned_char_ptr(n_in, 2);
        inlen = gen_int_ptr(n_inlen, 3);
        quoteChar = gen_int(n_quoteChar, 4);

        ret_val = htmlEncodeEntities(out, outlen, (const unsigned char *)in, inlen, quoteChar);
        desret_int(ret_val);
        call_tests++;
        des_unsigned_char_ptr(n_out, out, 0);
        des_int_ptr(n_outlen, outlen, 1);
        des_const_unsigned_char_ptr(n_in, (const unsigned char *)in, 2);
        des_int_ptr(n_inlen, inlen, 3);
        des_int(n_quoteChar, quoteChar, 4);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlEncodeEntities",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_out);
            printf(" %d", n_outlen);
            printf(" %d", n_in);
            printf(" %d", n_inlen);
            printf(" %d", n_quoteChar);
            printf("\n");
        }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}